

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O0

PUThread *
p_uthread_create_full
          (PUThreadFunc func,ppointer data,pboolean joinable,PUThreadPriority prio,psize stack_size,
          pchar *name)

{
  pchar *ppVar1;
  PUThreadBase *base_thread;
  pchar *name_local;
  psize stack_size_local;
  PUThreadPriority prio_local;
  pboolean joinable_local;
  ppointer data_local;
  PUThreadFunc func_local;
  
  if (func == (PUThreadFunc)0x0) {
    func_local = (PUThreadFunc)0x0;
  }
  else {
    p_spinlock_lock(pp_uthread_new_spin);
    func_local = (PUThreadFunc)p_uthread_create_internal(pp_uthread_proxy,joinable,prio,stack_size);
    if ((PUThread *)func_local != (PUThread *)0x0) {
      (((PUThread *)func_local)->base).ref_count = 2;
      (((PUThread *)func_local)->base).ours = 1;
      (((PUThread *)func_local)->base).joinable = joinable;
      (((PUThread *)func_local)->base).func = func;
      (((PUThread *)func_local)->base).data = data;
      ppVar1 = p_strdup(name);
      (((PUThread *)func_local)->base).name = ppVar1;
    }
    p_spinlock_unlock(pp_uthread_new_spin);
  }
  return (PUThread *)func_local;
}

Assistant:

P_LIB_API PUThread *
p_uthread_create_full (PUThreadFunc	func,
		       ppointer		data,
		       pboolean		joinable,
		       PUThreadPriority	prio,
		       psize		stack_size,
		       const pchar	*name)
{
	PUThreadBase *base_thread;

	if (P_UNLIKELY (func == NULL))
		return NULL;

	p_spinlock_lock (pp_uthread_new_spin);

	base_thread = (PUThreadBase *) p_uthread_create_internal (pp_uthread_proxy,
								  joinable,
								  prio,
								  stack_size);

	if (P_LIKELY (base_thread != NULL)) {
		base_thread->ref_count = 2;
		base_thread->ours      = TRUE;
		base_thread->joinable  = joinable;
		base_thread->func      = func;
		base_thread->data      = data;
		base_thread->name      = p_strdup (name);
	}

	p_spinlock_unlock (pp_uthread_new_spin);

	return (PUThread *) base_thread;
}